

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

float64 log_full_eval(vector_t obs,float32 norm,vector_t mean,vector_t *var_inv,uint32 veclen)

{
  vector_t pfVar1;
  void *ptr;
  ulong uVar2;
  void *ptr_00;
  ulong n_elem;
  ulong uVar3;
  double dVar4;
  
  n_elem = (ulong)veclen;
  ptr = __ckd_malloc__(n_elem * 8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                       ,0x370);
  for (uVar2 = 0; n_elem != uVar2; uVar2 = uVar2 + 1) {
    *(double *)((long)ptr + uVar2 * 8) = (double)(obs[uVar2] - mean[uVar2]);
  }
  ptr_00 = __ckd_calloc__(n_elem,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x378);
  for (uVar2 = 0; uVar2 != n_elem; uVar2 = uVar2 + 1) {
    pfVar1 = var_inv[uVar2];
    for (uVar3 = 0; n_elem != uVar3; uVar3 = uVar3 + 1) {
      *(double *)((long)ptr_00 + uVar3 * 8) =
           (double)pfVar1[uVar3] * *(double *)((long)ptr + uVar2 * 8) +
           *(double *)((long)ptr_00 + uVar3 * 8);
    }
  }
  dVar4 = (double)(float)norm;
  for (uVar2 = 0; n_elem != uVar2; uVar2 = uVar2 + 1) {
    dVar4 = dVar4 + *(double *)((long)ptr + uVar2 * 8) * -0.5 *
                    *(double *)((long)ptr_00 + uVar2 * 8);
  }
  ckd_free(ptr_00);
  ckd_free(ptr);
  return (float64)dVar4;
}

Assistant:

float64
log_full_eval(vector_t obs,
	      float32 norm,
	      vector_t mean,
	      vector_t *var_inv,
	      uint32 veclen)
{
    float64 *diff, *vtmp, d;
    uint32 i, j;
    
    d = norm;

    /* Precompute x-m */
    diff = ckd_malloc(veclen * sizeof(float64));
    for (i = 0; i < veclen; i++)
	diff[i] = obs[i] - mean[i];

    /* Compute -0.5 * (x-m) * sigma^-1 * (x-m)^T */
    /* FIXME: We could probably use BLAS for this, though it is
     * unclear if that would actually be faster (particularly with
     * refblas) */
    vtmp = ckd_calloc(veclen, sizeof(float64));
    for (i = 0; i < veclen; ++i)
	for (j = 0; j < veclen; ++j)
	    vtmp[j] += var_inv[i][j] * diff[i];
    for (i = 0; i < veclen; ++i)
	d -= 0.5 * diff[i] * vtmp[i];
    ckd_free(vtmp);
    ckd_free(diff);

    return d;
}